

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int isEndChunkEmpty(EndNoise *en,SurfaceNoise *sn,uint64_t seed,int chunkX,int chunkZ)

{
  double dVar1;
  int in_ECX;
  int iVar2;
  int in_R8D;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double pivot_1;
  double noise_1;
  double l_1;
  double u_1;
  double pivot;
  double noise;
  double l;
  double u;
  double eps;
  int id;
  int n;
  EndIsland is [2];
  float y [256];
  double depth [3] [3];
  int z;
  int x;
  int k;
  int j;
  int i;
  undefined8 in_stack_fffffffffffffb20;
  uint64_t in_stack_fffffffffffffb28;
  double in_stack_fffffffffffffb30;
  EndIsland *in_stack_fffffffffffffb38;
  EndNoise *in_stack_fffffffffffffb40;
  int local_4b0;
  int local_4ac;
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  SurfaceNoise *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  SurfaceNoise *in_stack_fffffffffffffba8;
  EndNoise *in_stack_fffffffffffffbb0;
  float *in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc30;
  double local_88 [6];
  double adStack_58 [3];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_38 = in_ECX << 1;
  local_3c = in_R8D << 1;
  local_30 = -1;
  local_28 = in_R8D;
  local_24 = in_ECX;
  do {
    if (1 < local_30) {
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
          fVar3 = getEndHeightNoise(in_stack_fffffffffffffb40,
                                    (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                                    (int)in_stack_fffffffffffffb38,
                                    (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
          local_88[(long)local_2c * 3 + (long)local_30] = (double)(fVar3 - 8.0);
          for (local_34 = 8; local_34 < 0xf; local_34 = local_34 + 1) {
            in_stack_fffffffffffffb40 = (EndNoise *)isEndChunkEmpty::upper_drop[local_34];
            in_stack_fffffffffffffb38 = (EndIsland *)isEndChunkEmpty::lower_drop[local_34];
            dVar5 = local_88[(long)local_2c * 3 + (long)local_30];
            dVar4 = sampleSurfaceNoiseBetween
                              (in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                               in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                               (double)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                               ,(double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ));
            dVar5 = lerp((double)in_stack_fffffffffffffb40,-3000.0,dVar4 + dVar5);
            in_stack_fffffffffffffb30 = lerp((double)in_stack_fffffffffffffb38,-30.0,dVar5);
            if (0.0 < in_stack_fffffffffffffb30) {
              return 0;
            }
          }
        }
      }
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        fVar3 = getEndHeightNoise(in_stack_fffffffffffffb40,
                                  (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                                  (int)in_stack_fffffffffffffb38,
                                  (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        local_88[(long)local_2c * 3 + 2] = (double)(fVar3 - 8.0);
      }
      for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
        fVar3 = getEndHeightNoise(in_stack_fffffffffffffb40,
                                  (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                                  (int)in_stack_fffffffffffffb38,
                                  (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        adStack_58[local_30] = (double)(fVar3 - 8.0);
      }
      local_2c = 0;
      do {
        if (2 < local_2c) {
          return 1;
        }
        for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
          for (local_34 = 2; local_34 < 0x12; local_34 = local_34 + 1) {
            dVar5 = isEndChunkEmpty::upper_drop[local_34];
            dVar4 = isEndChunkEmpty::lower_drop[local_34];
            dVar1 = local_88[(long)local_2c * 3 + (long)local_30];
            dVar6 = sampleSurfaceNoiseBetween
                              (in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                               in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                               (double)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                               ,(double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ));
            dVar5 = lerp(dVar5,-3000.0,dVar6 + dVar1);
            dVar5 = lerp(dVar4,-30.0,dVar5);
            if (0.0 < dVar5) {
              mapEndSurfaceHeight(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                                  in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
                                  in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                                  in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,
                                  in_stack_fffffffffffffc30);
              local_34 = 0;
              while( true ) {
                if (0xff < local_34) {
                  return 1;
                }
                if ((*(float *)(&stack0xfffffffffffffb78 + (long)local_34 * 4) != 0.0) ||
                   (NAN(*(float *)(&stack0xfffffffffffffb78 + (long)local_34 * 4)))) break;
                local_34 = local_34 + 1;
              }
              return 0;
            }
          }
        }
        local_2c = local_2c + 1;
      } while( true );
    }
    for (local_2c = -1; local_2c < 2; local_2c = local_2c + 1) {
      local_4ac = getEndIslands(in_stack_fffffffffffffb38,
                                (int)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                                in_stack_fffffffffffffb28,
                                (int)((ulong)in_stack_fffffffffffffb20 >> 0x20),
                                (int)in_stack_fffffffffffffb20);
      while (iVar2 = local_4ac + -1, 0 < local_4ac) {
        local_4ac = iVar2;
        if ((((local_24 * 0x10 <
               *(int *)(&stack0xfffffffffffffb58 + (long)iVar2 * 0x10) +
               *(int *)(&stack0xfffffffffffffb64 + (long)iVar2 * 0x10)) &&
             (local_28 * 0x10 <
              *(int *)(&stack0xfffffffffffffb60 + (long)iVar2 * 0x10) +
              *(int *)(&stack0xfffffffffffffb64 + (long)iVar2 * 0x10))) &&
            (*(int *)(&stack0xfffffffffffffb58 + (long)iVar2 * 0x10) -
             *(int *)(&stack0xfffffffffffffb64 + (long)iVar2 * 0x10) <= local_24 * 0x10 + 0xf)) &&
           ((*(int *)(&stack0xfffffffffffffb60 + (long)iVar2 * 0x10) -
             *(int *)(&stack0xfffffffffffffb64 + (long)iVar2 * 0x10) <= local_28 * 0x10 + 0xf &&
            (mapEndBiome((EndNoise *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         (int *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                         in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,
                         in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58), local_4b0 == 0x28))))
        {
          return 0;
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int isEndChunkEmpty(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    int chunkX, int chunkZ)
{
    int i, j, k;
    int x = chunkX * 2;
    int z = chunkZ * 2;
    double depth[3][3];
    float y[256];

    // check if small end islands intersect this chunk
    for (j = -1; j <= +1; j++)
    {
        for (i = -1; i <= +1; i++)
        {
            EndIsland is[2];
            int n = getEndIslands(is, en->mc, seed, chunkX+i, chunkZ+j);
            while (n --> 0)
            {
                if (is[n].x + is[n].r <= chunkX*16) continue;
                if (is[n].z + is[n].r <= chunkZ*16) continue;
                if (is[n].x - is[n].r > chunkX*16 + 15) continue;
                if (is[n].z - is[n].r > chunkZ*16 + 15) continue;
                int id;
                mapEndBiome(en, &id, is[n].x >> 4, is[n].z >> 4, 1, 1);
                if (id == small_end_islands)
                    return 0;
            }
        }
    }

    // clamped (32 + 46 - y) / 64.0
    static const double upper_drop[] = {
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, // 0-7
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, 63./64, // 8-15
        62./64, 61./64, 60./64, 59./64, 58./64, 57./64, 56./64, 55./64, // 16-23
        54./64, 53./64, 52./64, 51./64, 50./64, 49./64, 48./64, 47./64, // 24-31
        46./64 // 32
    };
    // clamped (y - 1) / 7.0
    static const double lower_drop[] = {
          0.0,  0.0, 1./7, 2./7, 3./7, 4./7, 5./7, 6./7, // 0-7
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 8-15
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 16-23
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 24-31
          1.0, // 32
    };
    // inverse of clamping func: ( 30 * (1-l) / l + 3000 * (1-u) ) / u
    static const double inverse_drop[] = {
        1e9, 1e9, 180.0, 75.0, 40.0, 22.5, 12.0, 5.0, // 0-7
        0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, // 8-14
        1000./21, 3000./31, 9000./61, 200.0, // 15-18
    };
    const double eps = 0.001;

    // get the inner depth values and see if they imply blocks in the chunk
    for (i = 0; i < 2; i++)
    {
        for (j = 0; j < 2; j++)
        {
            depth[i][j] = getEndHeightNoise(en, x+i, z+j, 0) - 8.0f;
            for (k = 8; k <= 14; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    return 0;
            }
        }
    }

    // fill in the depth values at the boundaries to neighbouring chunks
    for (i = 0; i < 3; i++)
        depth[i][2] = getEndHeightNoise(en, x+i, z+2, 0) - 8.0f;
    for (j = 0; j < 2; j++)
        depth[2][j] = getEndHeightNoise(en, x+2, z+j, 0) - 8.0f;

    // see if none of the noise values can generate blocks
    for (i = 0; i < 3; i++)
    {
        for (j = 0; j < 3; j++)
        {
            for (k = 2; k < 18; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    goto L_check_full;
            }
        }
    }
    return 1;

L_check_full:
    mapEndSurfaceHeight(y, en, sn, chunkX*16, chunkZ*16, 16, 16, 1, 0);
    for (k = 0; k < 256; k++)
        if (y[k] != 0) return 0;
    return 1;
}